

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O0

void __thiscall btRaycastVehicle::resetSuspension(btRaycastVehicle *this)

{
  int iVar1;
  btWheelInfo *this_00;
  btVector3 *in_RDI;
  btScalar bVar2;
  btVector3 bVar3;
  btWheelInfo *wheel;
  int i;
  undefined8 local_28;
  undefined8 local_20;
  int local_c;
  
  local_c = 0;
  while( true ) {
    iVar1 = btAlignedObjectArray<btWheelInfo>::size
                      ((btAlignedObjectArray<btWheelInfo> *)(in_RDI + 0xc));
    if (iVar1 <= local_c) break;
    this_00 = btAlignedObjectArray<btWheelInfo>::operator[]
                        ((btAlignedObjectArray<btWheelInfo> *)(in_RDI + 0xc),local_c);
    bVar2 = btWheelInfo::getSuspensionRestLength(this_00);
    (this_00->m_raycastInfo).m_suspensionLength = bVar2;
    this_00->m_suspensionRelativeVelocity = 0.0;
    bVar3 = operator-(in_RDI);
    local_28 = bVar3.m_floats._0_8_;
    *(undefined8 *)(this_00->m_raycastInfo).m_contactNormalWS.m_floats = local_28;
    local_20 = bVar3.m_floats._8_8_;
    *(undefined8 *)((this_00->m_raycastInfo).m_contactNormalWS.m_floats + 2) = local_20;
    this_00->m_clippedInvContactDotSuspension = 1.0;
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void btRaycastVehicle::resetSuspension()
{

	int i;
	for (i=0;i<m_wheelInfo.size();	i++)
	{
			btWheelInfo& wheel = m_wheelInfo[i];
			wheel.m_raycastInfo.m_suspensionLength = wheel.getSuspensionRestLength();
			wheel.m_suspensionRelativeVelocity = btScalar(0.0);
			
			wheel.m_raycastInfo.m_contactNormalWS = - wheel.m_raycastInfo.m_wheelDirectionWS;
			//wheel_info.setContactFriction(btScalar(0.0));
			wheel.m_clippedInvContactDotSuspension = btScalar(1.0);
	}
}